

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

CSVError * __thiscall
duckdb::CSVError::LineSizeError
          (CSVError *__return_storage_ptr__,CSVError *this,CSVReaderOptions *options,
          LinesPerBoundary error_info,string *csv_row,idx_t byte_position,string *current_path)

{
  LinesPerBoundary error_info_p;
  ostream *poVar1;
  optional_idx local_398;
  CSVReaderOptions *local_390;
  idx_t iStack_388;
  string local_380;
  string local_360;
  string local_340;
  ostringstream how_to_fix_it;
  ostringstream error;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  poVar1 = ::std::operator<<((ostream *)&error,"Maximum line size of ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::operator<<(poVar1," bytes exceeded. ");
  poVar1 = ::std::operator<<((ostream *)&error,"Actual Size:");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = ::std::operator<<(poVar1," bytes.");
  ::std::operator<<(poVar1,'\n');
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&how_to_fix_it);
  poVar1 = ::std::operator<<((ostream *)&how_to_fix_it,
                             "Possible Solution: Change the maximum length size, e.g., max_line_size="
                            );
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::operator<<(poVar1,anon_var_dwarf_4b71d2e + 8);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::string((string *)&local_380,(string *)error_info.lines_in_batch);
  local_390 = options;
  iStack_388 = error_info.boundary_idx;
  optional_idx::optional_idx(&local_398,(idx_t)csv_row);
  ::std::__cxx11::stringbuf::str();
  error_info_p.lines_in_batch = iStack_388;
  error_info_p.boundary_idx = (idx_t)local_390;
  CSVError(__return_storage_ptr__,&local_360,MAXIMUM_LINE_SIZE,0,&local_380,error_info_p,
           (idx_t)csv_row,local_398,(CSVReaderOptions *)this,&local_340,(string *)byte_position);
  ::std::__cxx11::string::~string((string *)&local_340);
  ::std::__cxx11::string::~string((string *)&local_380);
  ::std::__cxx11::string::~string((string *)&local_360);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&how_to_fix_it);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::LineSizeError(const CSVReaderOptions &options, LinesPerBoundary error_info, string &csv_row,
                                 idx_t byte_position, const string &current_path) {
	std::ostringstream error;
	error << "Maximum line size of " << options.maximum_line_size.GetValue() << " bytes exceeded. ";
	error << "Actual Size:" << csv_row.size() << " bytes." << '\n';

	std::ostringstream how_to_fix_it;
	how_to_fix_it << "Possible Solution: Change the maximum length size, e.g., max_line_size=" << csv_row.size() + 2
	              << "\n";

	return CSVError(error.str(), MAXIMUM_LINE_SIZE, 0, csv_row, error_info, byte_position, byte_position, options,
	                how_to_fix_it.str(), current_path);
}